

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_inter_pred_chroma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined2 *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [12];
  UWORD8 *pUVar14;
  WORD16 *pWVar15;
  int iVar16;
  long lVar17;
  WORD16 *pWVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  WORD16 *pWVar21;
  ulong uVar22;
  WORD16 *pWVar23;
  undefined1 auVar24 [16];
  undefined4 uVar25;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  int iVar37;
  int iVar38;
  undefined1 in_XMM2 [16];
  undefined1 auVar36 [16];
  int iVar39;
  undefined2 uVar47;
  undefined2 uVar48;
  undefined2 uVar49;
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined2 uVar74;
  undefined2 uVar75;
  undefined2 uVar76;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  
  uVar22 = *(ulong *)pi1_coeff;
  auVar36[0] = (char)uVar22;
  cVar30 = (char)(uVar22 >> 8);
  cVar31 = (char)(uVar22 >> 0x10);
  cVar32 = (char)(uVar22 >> 0x18);
  cVar33 = (char)(uVar22 >> 0x20);
  cVar34 = (char)(uVar22 >> 0x28);
  cVar35 = (char)(uVar22 >> 0x30);
  auVar28._8_6_ = 0;
  auVar28._0_8_ = uVar22;
  auVar28[0xe] = (char)(uVar22 >> 0x38);
  auVar28[0xf] = -((long)uVar22 < 0);
  auVar27._14_2_ = auVar28._14_2_;
  auVar27._8_5_ = 0;
  auVar27._0_8_ = uVar22;
  auVar27[0xd] = -(cVar35 < '\0');
  auVar86._13_3_ = auVar27._13_3_;
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar22;
  auVar86[0xc] = cVar35;
  auVar26._12_4_ = auVar86._12_4_;
  auVar26._8_3_ = 0;
  auVar26._0_8_ = uVar22;
  auVar26[0xb] = -(cVar34 < '\0');
  auVar81._11_5_ = auVar26._11_5_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar22;
  auVar81[10] = cVar34;
  auVar65._10_6_ = auVar81._10_6_;
  auVar65[8] = 0;
  auVar65._0_8_ = uVar22;
  auVar65[9] = -(cVar33 < '\0');
  auVar59._9_7_ = auVar65._9_7_;
  auVar59[8] = cVar33;
  auVar59._0_8_ = uVar22;
  auVar13._4_8_ = auVar59._8_8_;
  auVar13[3] = -(cVar32 < '\0');
  auVar13[2] = cVar32;
  auVar13[1] = -(cVar31 < '\0');
  auVar13[0] = cVar31;
  auVar36._4_12_ = auVar13;
  auVar36[3] = -(cVar30 < '\0');
  auVar36[2] = cVar30;
  auVar36[1] = -(auVar36[0] < '\0');
  uVar25 = auVar36._0_4_;
  auVar29._4_4_ = auVar13._0_4_;
  auVar24._4_4_ = uVar25;
  auVar24._0_4_ = uVar25;
  auVar24._8_4_ = uVar25;
  auVar24._12_4_ = uVar25;
  auVar29._0_4_ = auVar29._4_4_;
  auVar29._8_4_ = auVar29._4_4_;
  auVar29._12_4_ = auVar29._4_4_;
  if ((wd & 3U) == 0) {
    if (0 < wd) {
      lVar17 = (long)(src_strd * 2) * 2;
      uVar22 = 0;
      auVar36 = pmovsxbd(in_XMM2,0x20202020);
      do {
        if (0 < ht) {
          pUVar14 = pu1_dst + uVar22;
          iVar16 = 0;
          pauVar19 = (undefined1 (*) [16])pi2_src;
          do {
            auVar59 = *(undefined1 (*) [16])((long)pauVar19 + (long)src_strd * -2);
            auVar65 = *pauVar19;
            auVar81 = *(undefined1 (*) [16])(*pauVar19 + (long)src_strd * 2);
            auVar26 = *(undefined1 (*) [16])(*pauVar19 + lVar17);
            auVar80._0_12_ = auVar59._0_12_;
            auVar80._12_2_ = auVar59._6_2_;
            auVar80._14_2_ = auVar65._6_2_;
            auVar79._12_4_ = auVar80._12_4_;
            auVar79._0_10_ = auVar59._0_10_;
            auVar79._10_2_ = auVar65._4_2_;
            auVar78._10_6_ = auVar79._10_6_;
            auVar78._0_8_ = auVar59._0_8_;
            auVar78._8_2_ = auVar59._4_2_;
            auVar77._8_8_ = auVar78._8_8_;
            auVar77._6_2_ = auVar65._2_2_;
            auVar77._4_2_ = auVar59._2_2_;
            auVar77._0_2_ = auVar59._0_2_;
            auVar77._2_2_ = auVar65._0_2_;
            auVar60._2_2_ = auVar65._8_2_;
            auVar60._0_2_ = auVar59._8_2_;
            auVar60._4_2_ = auVar59._10_2_;
            auVar60._6_2_ = auVar65._10_2_;
            auVar60._8_2_ = auVar59._12_2_;
            auVar60._10_2_ = auVar65._12_2_;
            auVar60._12_2_ = auVar59._14_2_;
            auVar60._14_2_ = auVar65._14_2_;
            auVar91._0_12_ = auVar65._0_12_;
            auVar91._12_2_ = auVar65._6_2_;
            auVar91._14_2_ = auVar81._6_2_;
            auVar90._12_4_ = auVar91._12_4_;
            auVar90._0_10_ = auVar65._0_10_;
            auVar90._10_2_ = auVar81._4_2_;
            auVar89._10_6_ = auVar90._10_6_;
            auVar89._0_8_ = auVar65._0_8_;
            auVar89._8_2_ = auVar65._4_2_;
            auVar88._8_8_ = auVar89._8_8_;
            auVar88._6_2_ = auVar81._2_2_;
            auVar88._4_2_ = auVar65._2_2_;
            auVar82._0_2_ = auVar81._0_2_;
            auVar88._2_2_ = auVar82._0_2_;
            auVar88._0_2_ = auVar65._0_2_;
            auVar54._2_2_ = auVar81._8_2_;
            auVar54._0_2_ = auVar65._8_2_;
            auVar54._4_2_ = auVar65._10_2_;
            auVar54._6_2_ = auVar81._10_2_;
            auVar54._8_2_ = auVar65._12_2_;
            auVar54._10_2_ = auVar81._12_2_;
            auVar54._12_2_ = auVar65._14_2_;
            auVar54._14_2_ = auVar81._14_2_;
            auVar85._0_12_ = auVar81._0_12_;
            auVar85._12_2_ = auVar81._6_2_;
            auVar85._14_2_ = auVar26._6_2_;
            auVar84._12_4_ = auVar85._12_4_;
            auVar84._0_10_ = auVar81._0_10_;
            auVar84._10_2_ = auVar26._4_2_;
            auVar83._10_6_ = auVar84._10_6_;
            auVar83._0_8_ = auVar81._0_8_;
            auVar83._8_2_ = auVar81._4_2_;
            auVar82._8_8_ = auVar83._8_8_;
            auVar82._6_2_ = auVar26._2_2_;
            auVar82._4_2_ = auVar81._2_2_;
            auVar82._2_2_ = auVar26._0_2_;
            auVar67._2_2_ = auVar26._8_2_;
            auVar67._0_2_ = auVar81._8_2_;
            auVar67._4_2_ = auVar81._10_2_;
            auVar67._6_2_ = auVar26._10_2_;
            auVar67._8_2_ = auVar81._12_2_;
            auVar67._10_2_ = auVar26._12_2_;
            auVar67._12_2_ = auVar81._14_2_;
            auVar67._14_2_ = auVar26._14_2_;
            auVar81 = pmaddwd(auVar77,auVar24);
            auVar59 = pmaddwd(auVar60,auVar24);
            auVar86 = pmaddwd(auVar82,auVar29);
            auVar65 = pmaddwd(auVar67,auVar29);
            iVar20 = auVar36._0_4_;
            iVar37 = auVar36._4_4_;
            iVar38 = auVar36._8_4_;
            iVar39 = auVar36._12_4_;
            auVar87._0_4_ = (auVar86._0_4_ + auVar81._0_4_ >> 6) + iVar20 >> 6;
            auVar87._4_4_ = (auVar86._4_4_ + auVar81._4_4_ >> 6) + iVar37 >> 6;
            auVar87._8_4_ = (auVar86._8_4_ + auVar81._8_4_ >> 6) + iVar38 >> 6;
            auVar87._12_4_ = (auVar86._12_4_ + auVar81._12_4_ >> 6) + iVar39 >> 6;
            auVar81 = packssdw(auVar87,auVar87);
            auVar68._0_4_ = (auVar65._0_4_ + auVar59._0_4_ >> 6) + iVar20 >> 6;
            auVar68._4_4_ = (auVar65._4_4_ + auVar59._4_4_ >> 6) + iVar37 >> 6;
            auVar68._8_4_ = (auVar65._8_4_ + auVar59._8_4_ >> 6) + iVar38 >> 6;
            auVar68._12_4_ = (auVar65._12_4_ + auVar59._12_4_ >> 6) + iVar39 >> 6;
            auVar59 = packssdw(auVar68,auVar68);
            sVar5 = auVar81._0_2_;
            sVar6 = auVar81._2_2_;
            sVar7 = auVar81._4_2_;
            sVar8 = auVar81._6_2_;
            sVar9 = auVar59._0_2_;
            sVar10 = auVar59._2_2_;
            sVar11 = auVar59._4_2_;
            sVar12 = auVar59._6_2_;
            *(ulong *)pUVar14 =
                 CONCAT44(CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar59[6] - (0xff < sVar12),
                                   CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar59[4] -
                                            (0xff < sVar11),
                                            CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar59[2] -
                                                     (0xff < sVar10),
                                                     (0 < sVar9) * (sVar9 < 0x100) * auVar59[0] -
                                                     (0xff < sVar9)))),
                          CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar81[6] - (0xff < sVar8),
                                   CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar81[4] -
                                            (0xff < sVar7),
                                            CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar81[2] -
                                                     (0xff < sVar6),
                                                     (0 < sVar5) * (sVar5 < 0x100) * auVar81[0] -
                                                     (0xff < sVar5)))));
            puVar1 = (undefined2 *)(*pauVar19 + (long)(src_strd * 3) * 2);
            pauVar19 = (undefined1 (*) [16])(*pauVar19 + lVar17);
            auVar86 = pmaddwd(auVar88,auVar24);
            auVar65 = pmaddwd(auVar54,auVar24);
            auVar72._0_12_ = auVar26._0_12_;
            auVar72._12_2_ = auVar26._6_2_;
            auVar72._14_2_ = puVar1[3];
            auVar71._12_4_ = auVar72._12_4_;
            auVar71._0_10_ = auVar26._0_10_;
            auVar71._10_2_ = puVar1[2];
            auVar70._10_6_ = auVar71._10_6_;
            auVar70._0_8_ = auVar26._0_8_;
            auVar70._8_2_ = auVar26._4_2_;
            auVar69._8_8_ = auVar70._8_8_;
            auVar69._6_2_ = puVar1[1];
            auVar69._4_2_ = auVar26._2_2_;
            auVar69._2_2_ = *puVar1;
            auVar69._0_2_ = auVar26._0_2_;
            auVar45._2_2_ = puVar1[4];
            auVar45._0_2_ = auVar26._8_2_;
            auVar45._4_2_ = auVar26._10_2_;
            auVar45._6_2_ = puVar1[5];
            auVar45._8_2_ = auVar26._12_2_;
            auVar45._10_2_ = puVar1[6];
            auVar45._12_2_ = auVar26._14_2_;
            auVar45._14_2_ = puVar1[7];
            auVar81 = pmaddwd(auVar69,auVar29);
            auVar59 = pmaddwd(auVar45,auVar29);
            auVar73._0_4_ = (auVar81._0_4_ + auVar86._0_4_ >> 6) + iVar20 >> 6;
            auVar73._4_4_ = (auVar81._4_4_ + auVar86._4_4_ >> 6) + iVar37 >> 6;
            auVar73._8_4_ = (auVar81._8_4_ + auVar86._8_4_ >> 6) + iVar38 >> 6;
            auVar73._12_4_ = (auVar81._12_4_ + auVar86._12_4_ >> 6) + iVar39 >> 6;
            auVar81 = packssdw(auVar73,auVar73);
            auVar46._0_4_ = (auVar59._0_4_ + auVar65._0_4_ >> 6) + iVar20 >> 6;
            auVar46._4_4_ = (auVar59._4_4_ + auVar65._4_4_ >> 6) + iVar37 >> 6;
            auVar46._8_4_ = (auVar59._8_4_ + auVar65._8_4_ >> 6) + iVar38 >> 6;
            auVar46._12_4_ = (auVar59._12_4_ + auVar65._12_4_ >> 6) + iVar39 >> 6;
            auVar59 = packssdw(auVar46,auVar46);
            sVar5 = auVar81._0_2_;
            sVar6 = auVar81._2_2_;
            sVar7 = auVar81._4_2_;
            sVar8 = auVar81._6_2_;
            sVar9 = auVar59._0_2_;
            sVar10 = auVar59._2_2_;
            sVar11 = auVar59._4_2_;
            sVar12 = auVar59._6_2_;
            *(ulong *)(pUVar14 + dst_strd) =
                 CONCAT44(CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar59[6] - (0xff < sVar12),
                                   CONCAT12((0 < sVar11) * (sVar11 < 0x100) * auVar59[4] -
                                            (0xff < sVar11),
                                            CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar59[2] -
                                                     (0xff < sVar10),
                                                     (0 < sVar9) * (sVar9 < 0x100) * auVar59[0] -
                                                     (0xff < sVar9)))),
                          CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar81[6] - (0xff < sVar8),
                                   CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar81[4] -
                                            (0xff < sVar7),
                                            CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar81[2] -
                                                     (0xff < sVar6),
                                                     (0 < sVar5) * (sVar5 < 0x100) * auVar81[0] -
                                                     (0xff < sVar5)))));
            pUVar14 = pUVar14 + dst_strd * 2;
            iVar16 = iVar16 + 2;
          } while (iVar16 < ht);
        }
        uVar22 = uVar22 + 8;
        pi2_src = (WORD16 *)((long)pi2_src + 0x10);
      } while (uVar22 < (uint)(wd * 2));
    }
  }
  else if (0 < ht) {
    iVar16 = src_strd * 2;
    pWVar15 = pi2_src + -(long)src_strd;
    pWVar21 = pi2_src + src_strd;
    pWVar23 = pi2_src + iVar16;
    pWVar18 = pi2_src + src_strd * 3;
    pUVar14 = pu1_dst + dst_strd;
    iVar20 = 0;
    auVar36 = pmovsxbd(in_XMM2,0x20202020);
    do {
      if (0 < wd) {
        lVar17 = 0;
        do {
          uVar22 = *(ulong *)(pWVar15 + lVar17);
          uVar2 = *(ulong *)(pi2_src + lVar17);
          uVar49 = (undefined2)(uVar2 >> 0x30);
          auVar58._8_4_ = 0;
          auVar58._0_8_ = uVar22;
          auVar58._12_2_ = (short)(uVar22 >> 0x30);
          auVar58._14_2_ = uVar49;
          uVar48 = (undefined2)(uVar2 >> 0x20);
          auVar57._12_4_ = auVar58._12_4_;
          auVar57._8_2_ = 0;
          auVar57._0_8_ = uVar22;
          auVar57._10_2_ = uVar48;
          auVar56._10_6_ = auVar57._10_6_;
          auVar56._8_2_ = (short)(uVar22 >> 0x20);
          auVar56._0_8_ = uVar22;
          uVar47 = (undefined2)(uVar2 >> 0x10);
          auVar55._8_8_ = auVar56._8_8_;
          auVar55._6_2_ = uVar47;
          auVar55._4_2_ = (short)(uVar22 >> 0x10);
          auVar50._0_2_ = (undefined2)uVar2;
          auVar55._0_2_ = (undefined2)uVar22;
          auVar55._2_2_ = auVar50._0_2_;
          auVar59 = pmaddwd(auVar55,auVar24);
          uVar22 = *(ulong *)(pWVar21 + lVar17);
          uVar3 = *(ulong *)(pWVar23 + lVar17);
          uVar76 = (undefined2)(uVar22 >> 0x30);
          auVar53._8_4_ = 0;
          auVar53._0_8_ = uVar2;
          auVar53._12_2_ = uVar49;
          auVar53._14_2_ = uVar76;
          auVar52._12_4_ = auVar53._12_4_;
          auVar52._8_2_ = 0;
          auVar52._0_8_ = uVar2;
          uVar75 = (undefined2)(uVar22 >> 0x20);
          auVar52._10_2_ = uVar75;
          auVar51._10_6_ = auVar52._10_6_;
          auVar51._8_2_ = uVar48;
          auVar51._0_8_ = uVar2;
          auVar50._8_8_ = auVar51._8_8_;
          uVar74 = (undefined2)(uVar22 >> 0x10);
          auVar50._6_2_ = uVar74;
          auVar50._4_2_ = uVar47;
          auVar61._0_2_ = (undefined2)uVar22;
          auVar50._2_2_ = auVar61._0_2_;
          uVar49 = (undefined2)(uVar3 >> 0x30);
          auVar64._8_4_ = 0;
          auVar64._0_8_ = uVar22;
          auVar64._12_2_ = uVar76;
          auVar64._14_2_ = uVar49;
          uVar48 = (undefined2)(uVar3 >> 0x20);
          auVar63._12_4_ = auVar64._12_4_;
          auVar63._8_2_ = 0;
          auVar63._0_8_ = uVar22;
          auVar63._10_2_ = uVar48;
          auVar62._10_6_ = auVar63._10_6_;
          auVar62._8_2_ = uVar75;
          auVar62._0_8_ = uVar22;
          uVar47 = (undefined2)(uVar3 >> 0x10);
          auVar61._8_8_ = auVar62._8_8_;
          auVar61._6_2_ = uVar47;
          auVar61._4_2_ = uVar74;
          auVar40._0_2_ = (undefined2)uVar3;
          auVar61._2_2_ = auVar40._0_2_;
          auVar65 = pmaddwd(auVar61,auVar29);
          auVar66._0_4_ = (auVar65._0_4_ + auVar59._0_4_ >> 6) + auVar36._0_4_ >> 6;
          auVar66._4_4_ = (auVar65._4_4_ + auVar59._4_4_ >> 6) + auVar36._4_4_ >> 6;
          auVar66._8_4_ = (auVar65._8_4_ + auVar59._8_4_ >> 6) + auVar36._8_4_ >> 6;
          auVar66._12_4_ = (auVar65._12_4_ + auVar59._12_4_ >> 6) + auVar36._12_4_ >> 6;
          auVar59 = packssdw(auVar66,auVar66);
          sVar5 = auVar59._0_2_;
          sVar6 = auVar59._2_2_;
          sVar7 = auVar59._4_2_;
          sVar8 = auVar59._6_2_;
          *(ulong *)(pu1_dst + lVar17) =
               (ulong)CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8),
                               CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7),
                                        CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar59[2] -
                                                 (0xff < sVar6),
                                                 (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] -
                                                 (0xff < sVar5)))) |
               *(ulong *)(pu1_dst + lVar17) & 0xffffffff00000000;
          uVar4 = *(undefined8 *)(pWVar18 + lVar17);
          auVar65 = pmaddwd(auVar50,auVar24);
          auVar43._8_4_ = 0;
          auVar43._0_8_ = uVar3;
          auVar43._12_2_ = uVar49;
          auVar43._14_2_ = (short)((ulong)uVar4 >> 0x30);
          auVar42._12_4_ = auVar43._12_4_;
          auVar42._8_2_ = 0;
          auVar42._0_8_ = uVar3;
          auVar42._10_2_ = (short)((ulong)uVar4 >> 0x20);
          auVar41._10_6_ = auVar42._10_6_;
          auVar41._8_2_ = uVar48;
          auVar41._0_8_ = uVar3;
          auVar40._8_8_ = auVar41._8_8_;
          auVar40._6_2_ = (short)((ulong)uVar4 >> 0x10);
          auVar40._4_2_ = uVar47;
          auVar40._2_2_ = (short)uVar4;
          auVar59 = pmaddwd(auVar40,auVar29);
          auVar44._0_4_ = (auVar59._0_4_ + auVar65._0_4_ >> 6) + auVar36._0_4_ >> 6;
          auVar44._4_4_ = (auVar59._4_4_ + auVar65._4_4_ >> 6) + auVar36._4_4_ >> 6;
          auVar44._8_4_ = (auVar59._8_4_ + auVar65._8_4_ >> 6) + auVar36._8_4_ >> 6;
          auVar44._12_4_ = (auVar59._12_4_ + auVar65._12_4_ >> 6) + auVar36._12_4_ >> 6;
          auVar59 = packssdw(auVar44,auVar44);
          sVar5 = auVar59._0_2_;
          sVar6 = auVar59._2_2_;
          sVar7 = auVar59._4_2_;
          sVar8 = auVar59._6_2_;
          *(ulong *)(pUVar14 + lVar17) =
               (ulong)CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8),
                               CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7),
                                        CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar59[2] -
                                                 (0xff < sVar6),
                                                 (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] -
                                                 (0xff < sVar5)))) |
               *(ulong *)(pUVar14 + lVar17) & 0xffffffff00000000;
          lVar17 = lVar17 + 4;
        } while ((int)lVar17 < wd * 2);
      }
      pu1_dst = pu1_dst + dst_strd * 2;
      iVar20 = iVar20 + 2;
      pWVar15 = pWVar15 + iVar16;
      pWVar21 = pWVar21 + iVar16;
      pWVar23 = pWVar23 + iVar16;
      pWVar18 = pWVar18 + iVar16;
      pi2_src = pi2_src + iVar16;
      pUVar14 = pUVar14 + dst_strd * 2;
    } while (iVar20 < ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                               UWORD8 *pu1_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b;
    __m128i s4_8x16b, s5_8x16b, s6_8x16b, s7_8x16b, s8_8x16b, s9_8x16b;
    __m128i s11_8x16b, s12_8x16b, s15_8x16b, s16_8x16b;
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;
    __m128i s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b;
    __m128i s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b;


/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

/*  seting  values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);

/*  outer for loop starts from here */
    if(wd % 4 == 0)
    { /* wd = multiple of 8 case */

        pi2_src_copy = pi2_src;
        pu1_dst_copy = pu1_dst;

        for(col = 0; col < 2 * wd; col += 8)
        {

            pi2_src = pi2_src_copy + col;
            pu1_dst = pu1_dst_copy + col;


            for(row = 0; row < ht; row += 2)
            {

                /*load 16 pixel values */
                s21_8x16b  = _mm_load_si128((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 16 pixel values */
                s22_8x16b = _mm_load_si128((__m128i *)(pi2_src + (0 * src_strd)));


                /*load 16 pixel values */
                s23_8x16b = _mm_load_si128((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 16 pixel values */
                s24_8x16b = _mm_load_si128((__m128i *)(pi2_src + (2 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s21_8x16b, s22_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s23_8x16b, s24_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b);

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s7_8x16b);


                s25_8x16b = _mm_load_si128((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);

                s31_8x16b = _mm_unpackhi_epi16(s22_8x16b, s23_8x16b);

                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s32_8x16b = _mm_madd_epi16(s31_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);

                s33_8x16b = _mm_unpackhi_epi16(s24_8x16b, s25_8x16b);

                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s34_8x16b = _mm_madd_epi16(s33_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                s35_8x16b = _mm_add_epi32(s32_8x16b, s34_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s32_8x16b = _mm_srai_epi32(s35_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s33_8x16b = _mm_add_epi32(s32_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s34_8x16b = _mm_srai_epi32(s33_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s35_8x16b = _mm_packs_epi32(s34_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s33_8x16b =  _mm_packus_epi16(s35_8x16b, zero_8x16b);

                s7_8x16b = _mm_unpacklo_epi32(s7_8x16b, s33_8x16b);
/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s7_8x16b);

                pi2_src += 2 * src_strd;
                pu1_dst += 2 * dst_strd;


            } /* inner for loop ends here(8-output values in single iteration) */

        }
    }
    else
    { /* wd = multiple of 4 case */

        for(row = 0; row < ht; row += 2)
        {
            pi2_src_copy = pi2_src;
            pu1_dst_copy = pu1_dst;
            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 8 pixel values  */
                s21_8x16b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

                /*load 8 pixel values */
                s22_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s21_8x16b, s22_8x16b);

                s11_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                /*load 8 pixel values */
                s23_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

                /*load 8 pixel values */
                s24_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

                s6_8x16b = _mm_unpacklo_epi16(s23_8x16b, s24_8x16b);

                s12_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s11_8x16b, s12_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */


                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

                s25_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

                s5_8x16b = _mm_unpacklo_epi16(s22_8x16b, s23_8x16b);
                s15_8x16b = _mm_madd_epi16(s5_8x16b, coeff0_1_8x16b);

                s6_8x16b = _mm_unpacklo_epi16(s24_8x16b, s25_8x16b);
                s16_8x16b = _mm_madd_epi16(s6_8x16b, coeff2_3_8x16b);

                s8_8x16b = _mm_add_epi32(s15_8x16b, s16_8x16b); /* (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) */

                /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s6_8x16b = _mm_srai_epi32(s8_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
                s7_8x16b = _mm_add_epi32(s6_8x16b, offset_8x16b);

                /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
                s8_8x16b = _mm_srai_epi32(s7_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

                s9_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);

                /* i2_tmp = CLIP_U8(i2_tmp);*/
                s7_8x16b = _mm_packus_epi16(s9_8x16b, zero_8x16b);

                s9_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
                s5_8x16b =  _mm_and_si128(s9_8x16b, mask_low_32b);
                s6_8x16b =  _mm_and_si128(s7_8x16b, mask_high_96b);
                s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

/* store 8 8-bit output values  */
                /* pu1_dst[col] = (UWORD8)i2_tmp; */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s9_8x16b);

                pi2_src += 4;   /* To pointer update */
                pu1_dst += 4;
            } /* inner for loop ends here(8-output values in single iteration) */

            pi2_src = pi2_src_copy + 2 * src_strd; /* pointer update */
            pu1_dst = pu1_dst_copy + 2 * dst_strd; /* pointer update */
        }
    }

}